

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.h
# Opt level: O2

void __thiscall vm_bif_entry_t::link_to_image(vm_bif_entry_t *this,ushort set_idx)

{
  vm_bif_desc *pvVar1;
  ulong uVar2;
  ushort i;
  ushort uVar3;
  
  (*this->attach)();
  for (uVar3 = 0; uVar2 = (ulong)uVar3, uVar2 < this->func_count; uVar3 = uVar3 + 1) {
    pvVar1 = this->func;
    pvVar1[uVar2].bifptr.typ = VM_BIFPTR;
    pvVar1[uVar2].bifptr.val.prop = set_idx;
    pvVar1[uVar2].bifptr.val.bifptr.func_idx = uVar3;
    vm_bif_desc::init_synth_hdr(this->func + uVar2);
  }
  return;
}

Assistant:

void link_to_image(VMG_ ushort set_idx)
    {
        /* initialize the function set */
        (*attach)(vmg0_);

        /* link each function entry */
        for (ushort i = 0 ; i < func_count ; ++i)
        {
            /* set up the bifptr value for the function */
            func[i].bifptr.set_bifptr(set_idx, i);

            /* generate the synthetic method header for the function */
            func[i].init_synth_hdr();
        }
    }